

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

void t2_putnumpasses(opj_bio_t *bio,int n)

{
  int in_ESI;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 1) {
    bio_write((opj_bio_t *)CONCAT44(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
              in_stack_ffffffffffffffe8);
  }
  else if (in_ESI == 2) {
    bio_write((opj_bio_t *)CONCAT44(2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
              in_stack_ffffffffffffffe8);
  }
  else if (in_ESI < 6) {
    bio_write((opj_bio_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
              in_stack_ffffffffffffffe8);
  }
  else if (in_ESI < 0x25) {
    bio_write((opj_bio_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
              in_stack_ffffffffffffffe8);
  }
  else if (in_ESI < 0xa5) {
    bio_write((opj_bio_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
              in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static void t2_putnumpasses(opj_bio_t *bio, int n) {
	if (n == 1) {
		bio_write(bio, 0, 1);
	} else if (n == 2) {
		bio_write(bio, 2, 2);
	} else if (n <= 5) {
		bio_write(bio, 0xc | (n - 3), 4);
	} else if (n <= 36) {
		bio_write(bio, 0x1e0 | (n - 6), 9);
	} else if (n <= 164) {
		bio_write(bio, 0xff80 | (n - 37), 16);
	}
}